

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpat.cpp
# Opt level: O1

int __thiscall
CVmObjPattern::getp_get_str(CVmObjPattern *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  char *pcVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  int iVar3;
  
  if (getp_get_str(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_get_str();
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,argc,&getp_get_str::desc);
  if (iVar3 == 0) {
    pcVar1 = (this->super_CVmObject).ext_;
    aVar2 = *(anon_union_8_8_cb74652f_for_val *)(pcVar1 + 0x10);
    *(undefined8 *)retval = *(undefined8 *)(pcVar1 + 8);
    retval->val = aVar2;
  }
  return 1;
}

Assistant:

int CVmObjPattern::getp_get_str(VMG_ vm_obj_id_t self,
                                vm_val_t *retval, uint *argc)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* retrieve my original string value */
    *retval = *get_orig_str();

    /* handled */
    return TRUE;
}